

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

int AF_A_SelectSigilDown(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  player_t *this;
  AWeapon *pAVar3;
  PClass *pPVar4;
  PClass *pPVar5;
  DPSprite *this_00;
  undefined4 in_register_00000014;
  ulong uVar6;
  int iVar7;
  VMValue *pVVar8;
  char *__assertion;
  undefined8 *puVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005fb2f4;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar9 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar9 == (undefined8 *)0x0) {
LAB_005fb1cc:
        puVar9 = (undefined8 *)0x0;
        pVVar8 = param;
      }
      else {
        auVar12._8_8_ = uVar6;
        auVar12._0_8_ = puVar9[1];
        if (puVar9[1] == 0) {
          auVar12 = (**(code **)*puVar9)(puVar9);
          puVar9[1] = auVar12._0_8_;
        }
        pPVar5 = auVar12._0_8_;
        bVar10 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar10;
        uVar6 = (ulong)bVar10;
        bVar11 = pPVar5 == pPVar4;
        if (!bVar11 && !bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar4) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        pVVar8 = (VMValue *)(ulong)(bVar11 || bVar10);
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005fb2f4;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005fb289;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005fb2e4;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar6,ret);
              puVar2[1] = pPVar5;
            }
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar4 && bVar10) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar10 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar4) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar10) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005fb2f4;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005fb2e4;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005fb289:
        this = (player_t *)puVar9[0x40];
        if (this != (player_t *)0x0) {
          pAVar3 = this->ReadyWeapon;
          iVar7 = *(int *)&pAVar3[1].super_AInventory.super_AActor.super_DThinker.super_DObject.
                           _vptr_DObject;
          *(undefined4 *)
           &pAVar3[1].super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject = 0;
          if (iVar7 == 0) {
            iVar7 = *(int *)&pAVar3->field_0x584;
          }
          this_00 = player_t::GetPSprite(this,PSP_WEAPON);
          DPSprite::SetState(this_00,this_00->State + iVar7,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005fb2f4;
    }
    if (puVar9 == (undefined8 *)0x0) goto LAB_005fb1cc;
  }
LAB_005fb2e4:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005fb2f4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x36c,"int AF_A_SelectSigilDown(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SelectSigilDown)
{
	PARAM_ACTION_PROLOGUE;

	DPSprite *pspr;
	int pieces;

	if (self->player == nullptr)
	{
		return 0;
	}
	pieces = static_cast<ASigil*>(self->player->ReadyWeapon)->DownPieces;
	static_cast<ASigil*>(self->player->ReadyWeapon)->DownPieces = 0;
	if (pieces == 0)
	{
		pieces = static_cast<ASigil*>(self->player->ReadyWeapon)->NumPieces;
	}
	pspr = self->player->GetPSprite(PSP_WEAPON);
	pspr->SetState(pspr->GetState() + pieces);
	return 0;
}